

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t x130;
  uint64_t x129;
  uint64_t x128;
  uint64_t x127;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
  uint64_t x125;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
  uint64_t x123;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
  uint64_t x121;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
  uint64_t x119;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
  uint64_t x117;
  uint64_t x116;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x115;
  uint64_t x114;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
  uint64_t x112;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
  uint64_t x110;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
  uint64_t x108;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x107;
  uint64_t x106;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x105;
  uint64_t x104;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x103;
  uint64_t x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  uint64_t x98;
  uint64_t x97;
  uint64_t x96;
  uint64_t x95;
  uint64_t x94;
  uint64_t x93;
  uint64_t x92;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x91;
  uint64_t x90;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x89;
  uint64_t x88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
  uint64_t x86;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
  uint64_t x84;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
  uint64_t x82;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x81;
  uint64_t x80;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x79;
  uint64_t x78;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x77;
  uint64_t x76;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x75;
  uint64_t x74;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x73;
  uint64_t x72;
  uint64_t x71;
  uint64_t x70;
  uint64_t x69;
  uint64_t x68;
  uint64_t x67;
  uint64_t x66;
  uint64_t x65;
  uint64_t x64;
  uint64_t x63;
  uint64_t x62;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x61;
  uint64_t x60;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x59;
  uint64_t x58;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x57;
  uint64_t x56;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x55;
  uint64_t x54;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x53;
  uint64_t x52;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x51;
  uint64_t x50;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x49;
  uint64_t x48;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x47;
  uint64_t x46;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x45;
  uint64_t x44;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x43;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  uint64_t x35;
  uint64_t x34;
  uint64_t x33;
  uint64_t x32;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
  uint64_t x30;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x29;
  uint64_t x28;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x27;
  uint64_t x26;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x25;
  uint64_t x24;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x23;
  uint64_t x22;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x21;
  uint64_t x20;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x19;
  uint64_t x18;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
  uint64_t x16;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
  uint64_t x14;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t local_420;
  uint64_t local_418;
  uint64_t local_410;
  uint64_t in_stack_fffffffffffffbf8;
  uint64_t in_stack_fffffffffffffc00;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffffc0f;
  undefined7 in_stack_fffffffffffffc10;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffffc17;
  uint64_t local_3e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3d9;
  uint64_t local_3d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3c9;
  uint64_t local_3c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3b9;
  uint64_t local_3b8;
  uint64_t local_3b0;
  byte local_3a1;
  uint64_t local_3a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_391;
  uint64_t local_390;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_381;
  uint64_t local_380;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_371;
  uint64_t local_370;
  byte local_361;
  uint64_t local_360;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_351;
  uint64_t local_350;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_341;
  uint64_t local_340;
  uint64_t local_338;
  uint64_t local_330;
  uint64_t local_328;
  uint64_t local_320;
  uint64_t local_318;
  uint64_t local_310;
  uint64_t local_308;
  uint64_t local_300;
  uint64_t local_2f8;
  uint64_t local_2f0;
  byte local_2e1;
  uint64_t local_2e0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2d1;
  uint64_t local_2d0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2c1;
  uint64_t local_2c0;
  byte local_2b1;
  uint64_t local_2b0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2a1;
  uint64_t local_2a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_291;
  uint64_t local_290;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_281;
  uint64_t local_280;
  byte local_271;
  uint64_t local_270;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_261;
  uint64_t local_260;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_251;
  uint64_t local_250;
  uint64_t local_248;
  uint64_t local_240;
  uint64_t local_238;
  uint64_t local_230;
  uint64_t local_228;
  uint64_t local_220;
  uint64_t local_218;
  uint64_t local_210;
  uint64_t local_208;
  uint64_t local_200;
  byte local_1f1;
  uint64_t local_1f0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1e1;
  uint64_t local_1e0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1d1;
  uint64_t local_1d0;
  byte local_1c1;
  uint64_t local_1c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1b1;
  uint64_t local_1b0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1a1;
  uint64_t local_1a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_191;
  uint64_t local_190;
  byte local_181;
  uint64_t local_180;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_171;
  uint64_t local_170;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_161;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  uint64_t local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t local_110;
  byte local_101;
  uint64_t local_100;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_f1;
  uint64_t local_f0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_e1;
  uint64_t local_e0;
  byte local_d1;
  uint64_t local_d0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_c1;
  uint64_t local_c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_b1;
  uint64_t local_b0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_a1;
  uint64_t local_a0;
  byte local_91;
  uint64_t local_90;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_81;
  uint64_t local_80;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_71;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  uint64_t *local_8;
  
  local_18 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_20,&local_28,local_18,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_30,&local_38,local_20,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_40,&local_48,local_20,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_50,&local_58,local_20,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_60,&local_68,local_20,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_70,&local_71,'\0',local_68,local_50);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_80,&local_81,local_71,local_58,local_40);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_90,&local_91,local_81,local_48,local_30);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_a0,&local_a1,'\0',local_18,local_60);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&local_b0,&local_b1,local_a1,0,local_70)
  ;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&local_c0,&local_c1,local_b1,0,local_80)
  ;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&local_d0,&local_d1,local_c1,0,local_90)
  ;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_e0,&local_e1,'\0',local_b0,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&local_f0,&local_f1,local_e1,local_c0,0)
  ;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_100,&local_101,local_f1,local_d0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_110,&local_118,local_e0,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_120,&local_128,local_110,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_130,&local_138,local_110,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_140,&local_148,local_110,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_150,&local_158,local_110,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_160,&local_161,'\0',local_158,local_140);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_170,&local_171,local_161,local_148,local_130);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_180,&local_181,local_171,local_138,local_120);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_190,&local_191,'\0',local_e0,local_150);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1a0,&local_1a1,local_191,local_f0,local_160);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1b0,&local_1b1,local_1a1,local_100,local_170);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1c0,&local_1c1,local_1b1,
             (ulong)local_101 + (ulong)local_d1 + local_91 + local_38,local_180);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1d0,&local_1d1,'\0',local_1a0,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1e0,&local_1e1,local_1d1,local_1b0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1f0,&local_1f1,local_1e1,local_1c0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_200,&local_208,local_1d0,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_210,&local_218,local_200,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_220,&local_228,local_200,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_230,&local_238,local_200,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_240,&local_248,local_200,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_250,&local_251,'\0',local_248,local_230);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_260,&local_261,local_251,local_238,local_220);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_270,&local_271,local_261,local_228,local_210);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_280,&local_281,'\0',local_1d0,local_240);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_290,&local_291,local_281,local_1e0,local_250);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2a0,&local_2a1,local_291,local_1f0,local_260);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2b0,&local_2b1,local_2a1,
             (ulong)local_1f1 + (ulong)local_1c1 + local_181 + local_128,local_270);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2c0,&local_2c1,'\0',local_290,local_10[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2d0,&local_2d1,local_2c1,local_2a0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2e0,&local_2e1,local_2d1,local_2b0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_2f0,&local_2f8,local_2c0,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_300,&local_308,local_2f0,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_310,&local_318,local_2f0,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_320,&local_328,local_2f0,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_330,&local_338,local_2f0,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_340,&local_341,'\0',local_338,local_320);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_350,&local_351,local_341,local_328,local_310);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_360,&local_361,local_351,local_318,local_300);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_370,&local_371,'\0',local_2c0,local_330);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_380,&local_381,local_371,local_2d0,local_340);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_390,&local_391,local_381,local_2e0,local_350);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3a0,&local_3a1,local_391,
             (ulong)local_2e1 + (ulong)local_2b1 + local_271 + local_218,local_360);
  local_3b0 = (ulong)local_3a1 + local_361 + local_308;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_3b8,&local_3b9,'\0',local_380,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_3c8,&local_3c9,local_3b9,local_390,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_3d8,&local_3d9,local_3c9,local_3a0,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_3e8,&stack0xfffffffffffffc17,local_3d9,local_3b0,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffc08,&stack0xfffffffffffffc07,in_stack_fffffffffffffc17
             ,0,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0f,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0f,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0f,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0f,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *local_8 = in_stack_fffffffffffffbf8;
  local_8[1] = local_410;
  local_8[2] = local_418;
  local_8[3] = local_420;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_from_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
    uint64_t x18;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x19;
    uint64_t x20;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x23;
    uint64_t x24;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x27;
    uint64_t x28;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x47;
    uint64_t x48;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x49;
    uint64_t x50;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x51;
    uint64_t x52;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x53;
    uint64_t x54;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x55;
    uint64_t x56;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x57;
    uint64_t x58;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x59;
    uint64_t x60;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint64_t x72;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x73;
    uint64_t x74;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x75;
    uint64_t x76;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x77;
    uint64_t x78;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x79;
    uint64_t x80;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x81;
    uint64_t x82;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
    uint64_t x84;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
    uint64_t x88;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x89;
    uint64_t x90;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x91;
    uint64_t x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x103;
    uint64_t x104;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x105;
    uint64_t x106;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x107;
    uint64_t x108;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
    uint64_t x110;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
    uint64_t x112;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
    uint64_t x114;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x115;
    uint64_t x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
    uint64_t x119;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
    uint64_t x121;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
    uint64_t x123;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
    uint64_t x125;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
    uint64_t x127;
    uint64_t x128;
    uint64_t x129;
    uint64_t x130;
    x1 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x2, &x3, x1, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x4, &x5, x2, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x6, &x7, x2, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x8, &x9, x2, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x10, &x11, x2, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x12, &x13, 0x0,
                                                              x11, x8);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x14, &x15, x13,
                                                              x9, x6);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x16, &x17, x15,
                                                              x7, x4);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x18, &x19, 0x0,
                                                              x1, x10);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x20, &x21, x19,
                                                              0x0, x12);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x22, &x23, x21,
                                                              0x0, x14);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x24, &x25, x23,
                                                              0x0, x16);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x26, &x27, 0x0,
                                                              x20, (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x28, &x29, x27,
                                                              x22, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x30, &x31, x29,
                                                              x24, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x32, &x33, x26, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x34, &x35, x32, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x36, &x37, x32, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x38, &x39, x32, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x40, &x41, x32, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x42, &x43, 0x0,
                                                              x41, x38);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x44, &x45, x43,
                                                              x39, x36);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x46, &x47, x45,
                                                              x37, x34);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x48, &x49, 0x0,
                                                              x26, x40);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x50, &x51, x49,
                                                              x28, x42);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x52, &x53, x51,
                                                              x30, x44);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x54, &x55, x53, (x31 + (x25 + (x17 + x5))), x46);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x56, &x57, 0x0,
                                                              x50, (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x58, &x59, x57,
                                                              x52, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x60, &x61, x59,
                                                              x54, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x62, &x63, x56, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x64, &x65, x62, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x66, &x67, x62, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x68, &x69, x62, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x70, &x71, x62, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x72, &x73, 0x0,
                                                              x71, x68);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x74, &x75, x73,
                                                              x69, x66);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x76, &x77, x75,
                                                              x67, x64);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x78, &x79, 0x0,
                                                              x56, x70);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x80, &x81, x79,
                                                              x58, x72);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x82, &x83, x81,
                                                              x60, x74);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x84, &x85, x83, (x61 + (x55 + (x47 + x35))), x76);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x86, &x87, 0x0,
                                                              x80, (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x88, &x89, x87,
                                                              x82, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x90, &x91, x89,
                                                              x84, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x92, &x93, x86, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x94, &x95, x92, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x96, &x97, x92, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x98, &x99, x92, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x100, &x101, x92, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x102, &x103, 0x0,
                                                              x101, x98);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x104, &x105,
                                                              x103, x99, x96);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x106, &x107,
                                                              x105, x97, x94);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x108, &x109, 0x0,
                                                              x86, x100);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x110, &x111,
                                                              x109, x88, x102);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x112, &x113,
                                                              x111, x90, x104);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x114, &x115, x113, (x91 + (x85 + (x77 + x65))), x106);
    x116 = (x115 + (x107 + x95));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x117, &x118, 0x0, x110, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x119, &x120, x118, x112, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x121, &x122, x120, x114, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x123, &x124, x122, x116, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x125, &x126,
                                                               x124, 0x0, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x127, x126, x117,
                                                            x110);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x128, x126, x119,
                                                            x112);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x129, x126, x121,
                                                            x114);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x130, x126, x123,
                                                            x116);
    out1[0] = x127;
    out1[1] = x128;
    out1[2] = x129;
    out1[3] = x130;
}